

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O1

bool __thiscall
glcts::ShaderBitfieldOperationCaseBinaryInt::test
          (ShaderBitfieldOperationCaseBinaryInt *this,Data *data)

{
  long lVar1;
  GLint GVar2;
  int iVar3;
  GLuint GVar4;
  bool bVar5;
  long lVar6;
  GLuint local_2c;
  
  bVar5 = this->m_components < 1;
  if (0 < this->m_components) {
    local_2c = 0;
    GVar2 = (*this->m_func)(data->inIvec4[0],data->in2Ivec4[0],(GLint *)&local_2c);
    if (data->outIvec4[0] == GVar2) {
      lVar6 = 0x2c;
      do {
        if (data->inUvec4[lVar6] != local_2c) {
          return bVar5;
        }
        iVar3 = (int)lVar6 + -0x2b;
        bVar5 = this->m_components <= iVar3;
        if (this->m_components <= iVar3) {
          return bVar5;
        }
        local_2c = 0;
        GVar4 = (*this->m_func)(*(GLint *)((long)data + lVar6 * 4 + -0x9c),
                                data->inUvec4[lVar6 + -0x1b],(GLint *)&local_2c);
        lVar1 = lVar6 + -0xb;
        lVar6 = lVar6 + 1;
      } while (data->inUvec4[lVar1] == GVar4);
    }
  }
  return bVar5;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLint expected2 = 0;
			GLint expected  = m_func(data->inIvec4[i], data->in2Ivec4[i], expected2);
			if (data->outIvec4[i] != expected || data->out2Ivec4[i] != expected2)
			{
				return false;
			}
		}
		return true;
	}